

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

char * lua_pushfstring(lua_State *L,char *fmt,...)

{
  char *pcVar1;
  lua_State *in_RDX;
  long in_RDI;
  __va_list_tag *in_stack_00000098;
  char *in_stack_000000a0;
  lua_State *in_stack_000000a8;
  va_list argp;
  char *ret;
  
  if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x24) <=
      *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x20)) {
    lj_gc_step(in_RDX);
  }
  pcVar1 = lj_str_pushvf(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  return pcVar1;
}

Assistant:

LUA_API const char *lua_pushfstring(lua_State *L, const char *fmt, ...)
{
  const char *ret;
  va_list argp;
  lj_gc_check(L);
  va_start(argp, fmt);
  ret = lj_str_pushvf(L, fmt, argp);
  va_end(argp);
  return ret;
}